

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::rollModerateComputer(Dice *this)

{
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *__x;
  int iVar1;
  mapped_type *pmVar2;
  int i_1;
  int iVar3;
  int i;
  bool bVar4;
  DiceOptions value_1;
  key_type local_6c;
  key_type local_68;
  DiceOptions value;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_60;
  
  this_00 = &this->DiceValues;
  iVar3 = 6;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    iVar1 = rand();
    value = iVar1 % 6;
    pmVar2 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,&value);
    *pmVar2 = *pmVar2 + 1;
  }
  value_1 = Heal;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&value_1);
  iVar3 = *pmVar2;
  __x = &this->resolvedHand;
  local_6c = Heal;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](__x,&local_6c);
  *pmVar2 = *pmVar2 + iVar3;
  value_1 = Energy;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&value_1);
  iVar3 = *pmVar2;
  local_6c = Energy;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](__x,&local_6c);
  *pmVar2 = *pmVar2 + iVar3;
  resetDiceValuesMap(this);
  iVar3 = addToCount(this);
  if (iVar3 < 6) {
    iVar3 = 0;
    while( true ) {
      iVar1 = addToCount(this);
      if (6 - iVar1 <= iVar3) break;
      iVar1 = rand();
      value_1 = iVar1 % 6;
      pmVar2 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](this_00,&value_1);
      *pmVar2 = *pmVar2 + 1;
      iVar3 = iVar3 + 1;
    }
    local_6c = Heal;
    pmVar2 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,&local_6c);
    iVar3 = *pmVar2;
    local_68 = Heal;
    pmVar2 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](__x,&local_68);
    *pmVar2 = *pmVar2 + iVar3;
    local_6c = Energy;
    pmVar2 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,&local_6c);
    iVar3 = *pmVar2;
    local_68 = Energy;
    pmVar2 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](__x,&local_68);
    *pmVar2 = *pmVar2 + iVar3;
    resetDiceValuesMap(this);
  }
  iVar3 = addToCount(this);
  if (iVar3 < 6) {
    iVar3 = 0;
    while( true ) {
      iVar1 = addToCount(this);
      if (6 - iVar1 <= iVar3) break;
      iVar1 = rand();
      value_1 = iVar1 % 6;
      pmVar2 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](this_00,&value_1);
      *pmVar2 = *pmVar2 + 1;
      iVar3 = iVar3 + 1;
    }
  }
  addDiceValuesToResolvedHand(this);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::_Rb_tree(&local_60,&__x->_M_t);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::push_back(&this->historyOfResolvedRolls,(value_type *)&local_60);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&local_60);
  resetResolvedHand(this);
  resetDiceValuesMap(this);
  return;
}

Assistant:

void Dice::rollModerateComputer(){

    DiceOptions value;
    for(int i=0; i<6; i++)
    {
        value = randomDiceOption();
        this->DiceValues[value] ++;
    }

    this->resolvedHand[Heal] += this->DiceValues[Heal];
    this->resolvedHand[Energy] += this->DiceValues[Energy];

    resetDiceValuesMap();

    if(addToCount() <6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }

        this->resolvedHand[Heal] += this->DiceValues[Heal];
        this->resolvedHand[Energy] += this->DiceValues[Energy];
        resetDiceValuesMap();
    }

    if(addToCount() < 6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }
    }

    addDiceValuesToResolvedHand();
    storeResolvedHand(resolvedHand);

    resetResolvedHand();
    resetDiceValuesMap();

}